

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O3

void Bmcg_ManStop(Bmcg_Man_t *p)

{
  void *__ptr;
  void **__ptr_00;
  int *piVar1;
  int iVar2;
  Bmc_AndPar_t *pBVar3;
  long lVar4;
  
  Gia_ManStopP(&p->pFrames);
  Gia_ManStopP(&p->pClean);
  iVar2 = (p->vGia2Fr).nSize;
  if (0 < iVar2) {
    lVar4 = 0;
    do {
      __ptr = (p->vGia2Fr).pArray[lVar4];
      if ((void *)0x2 < __ptr) {
        free(__ptr);
        iVar2 = (p->vGia2Fr).nSize;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  __ptr_00 = (p->vGia2Fr).pArray;
  if (__ptr_00 != (void **)0x0) {
    free(__ptr_00);
    (p->vGia2Fr).pArray = (void **)0x0;
  }
  (p->vGia2Fr).nCap = 0;
  (p->vGia2Fr).nSize = 0;
  piVar1 = (p->vFr2Sat).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vFr2Sat).pArray = (int *)0x0;
  }
  (p->vFr2Sat).nCap = 0;
  (p->vFr2Sat).nSize = 0;
  piVar1 = (p->vCiMap).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCiMap).pArray = (int *)0x0;
  }
  (p->vCiMap).nCap = 0;
  (p->vCiMap).nSize = 0;
  pBVar3 = p->pPars;
  if (0 < pBVar3->nProcs) {
    lVar4 = 0;
    do {
      if (p->pSats[lVar4] != (bmcg_sat_solver *)0x0) {
        bmcg_sat_solver_stop(p->pSats[lVar4]);
        pBVar3 = p->pPars;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < pBVar3->nProcs);
  }
  free(p);
  return;
}

Assistant:

void Bmcg_ManStop( Bmcg_Man_t * p )
{
    int i;
    Gia_ManStopP( &p->pFrames );
    Gia_ManStopP( &p->pClean );
    Vec_PtrFreeData( &p->vGia2Fr );
    Vec_PtrErase( &p->vGia2Fr );
    Vec_IntErase( &p->vFr2Sat );
    Vec_IntErase( &p->vCiMap );
    for ( i = 0; i < p->pPars->nProcs; i++ )
        if ( p->pSats[i] ) 
            bmcg_sat_solver_stop( p->pSats[i] );
    ABC_FREE( p );
}